

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O0

ostream * pstack::operator<<(ostream *os,JSON<pstack::Dwarf::LineInfo,_char> *jo)

{
  JObject *pJVar1;
  ostream *poVar2;
  char local_4d [5];
  uint local_48 [5];
  char local_31;
  JObject local_30;
  LineInfo *local_20;
  LineInfo *lines;
  JSON<pstack::Dwarf::LineInfo,_char> *jo_local;
  ostream *os_local;
  
  local_20 = jo->object;
  lines = (LineInfo *)jo;
  jo_local = (JSON<pstack::Dwarf::LineInfo,_char> *)os;
  JObject::JObject(&local_30,os);
  local_31 = '\0';
  pJVar1 = JObject::field<char[16],bool,char>
                     (&local_30,(char (*) [16])"default_is_stmt",&local_20->default_is_stmt,
                      &local_31);
  local_48[0] = (uint)local_20->opcode_base;
  local_4d[4] = 0;
  pJVar1 = JObject::field<char[12],int,char>
                     (pJVar1,(char (*) [12])"opcode_base",(int *)local_48,local_4d + 4);
  local_4d[3] = 0;
  pJVar1 = JObject::field<char[15],std::vector<int,std::allocator<int>>,char>
                     (pJVar1,(char (*) [15])"opcode_lengths",&local_20->opcode_lengths,local_4d + 3)
  ;
  local_4d[2] = 0;
  pJVar1 = JObject::
           field<char[6],std::vector<pstack::Dwarf::FileEntry,std::allocator<pstack::Dwarf::FileEntry>>,char>
                     (pJVar1,(char (*) [6])"files",&local_20->files,local_4d + 2);
  local_4d[1] = 0;
  pJVar1 = JObject::
           field<char[12],std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char>
                     (pJVar1,(char (*) [12])"directories",&local_20->directories,local_4d + 1);
  local_4d[0] = '\0';
  pJVar1 = JObject::
           field<char[7],std::vector<pstack::Dwarf::LineState,std::allocator<pstack::Dwarf::LineState>>,char>
                     (pJVar1,(char (*) [7])"matrix",&local_20->matrix,local_4d);
  poVar2 = JObject::operator_cast_to_ostream_(pJVar1);
  JObject::~JObject(&local_30);
  return poVar2;
}

Assistant:

std::ostream &operator << (std::ostream &os, const JSON<Dwarf::LineInfo, C> &jo) {
    auto &lines = jo.object;
    return JObject(os)
        .field("default_is_stmt",  lines.default_is_stmt)
        .field("opcode_base", int(lines.opcode_base))
        .field("opcode_lengths", lines.opcode_lengths)
        .field("files", lines.files)
        .field("directories", lines.directories)
        .field("matrix", lines.matrix);
}